

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::resolve(Tree *this)

{
  ulong uVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  refdata *prVar14;
  bool bVar15;
  int iVar16;
  size_t parent;
  csubstr *pcVar17;
  csubstr *pcVar18;
  NodeData *pNVar19;
  size_t sVar20;
  size_t sVar21;
  NodeType NVar22;
  long lVar23;
  NodeType_e NVar24;
  ulong uVar25;
  char *pcVar26;
  char *pcVar27;
  long lVar28;
  byte bVar29;
  char msg [38];
  ReferenceResolver rr;
  char local_568 [64];
  undefined4 uStack_528;
  undefined3 uStack_524;
  size_t local_518;
  size_t local_510;
  long local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  char *pcStack_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  char *pcStack_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  char *pcStack_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  char *pcStack_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  char *pcStack_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  char *pcStack_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  char *pcStack_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  char *pcStack_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  char *pcStack_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  char *pcStack_380;
  undefined8 local_378;
  ReferenceResolver local_370;
  
  bVar29 = 0;
  if (this->m_size != 0) {
    detail::ReferenceResolver::ReferenceResolver(&local_370,this);
    prVar14 = local_370.refs.m_stack;
    if (local_370.refs.m_size != 0) {
      local_508 = local_370.refs.m_size * 0x30;
      local_518 = 0xffffffffffffffff;
      lVar28 = 0;
      local_510 = 0xffffffffffffffff;
      do {
        if ((*(byte *)((long)&(prVar14->type).type + lVar28) & 0xc0) != 0) {
          uVar1 = *(ulong *)((long)&prVar14->parent_ref + lVar28);
          if (uVar1 == 0xffffffffffffffff) {
            uVar1 = *(ulong *)((long)&prVar14->node + lVar28);
            if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
              if (((byte)s_error_flags & 1) != 0) {
                bVar15 = is_debugger_attached();
                if (bVar15) {
                  pcVar2 = (code *)swi(3);
                  (*pcVar2)();
                  return;
                }
              }
              local_568[0] = '\0';
              local_568[1] = '\0';
              local_568[2] = '\0';
              local_568[3] = '\0';
              local_568[4] = '\0';
              local_568[5] = '\0';
              local_568[6] = '\0';
              local_568[7] = '\0';
              local_568[8] = -0x7a;
              local_568[9] = 'K';
              local_568[10] = '\0';
              local_568[0xb] = '\0';
              local_568[0xc] = '\0';
              local_568[0xd] = '\0';
              local_568[0xe] = '\0';
              local_568[0xf] = '\0';
              local_568[0x10] = '\0';
              local_568[0x11] = '\0';
              local_568[0x12] = '\0';
              local_568[0x13] = '\0';
              local_568[0x14] = '\0';
              local_568[0x15] = '\0';
              local_568[0x16] = '\0';
              local_568[0x17] = '\0';
              local_568[0x18] = -3;
              local_568[0x19] = 'f';
              local_568[0x1a] = '$';
              local_568[0x1b] = '\0';
              local_568[0x1c] = 0;
              local_568[0x1d] = 0;
              local_568[0x1e] = 0;
              local_568[0x1f] = 0;
              local_568[0x20] = 0x65;
              local_568[0x21] = '\0';
              local_568[0x22] = '\0';
              local_568[0x23] = 0;
              local_568[0x24] = 0;
              local_568[0x25] = 0;
              local_568[0x26] = 0;
              local_568[0x27] = 0;
              (*(code *)PTR_error_impl_00297798)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
            }
            pNVar19 = this->m_buf;
            if ((pNVar19[uVar1].m_type.type & KEY) != NOTYPE) {
              uVar1 = *(ulong *)((long)&prVar14->node + lVar28);
              if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_568[0] = '\0';
                local_568[1] = '\0';
                local_568[2] = '\0';
                local_568[3] = '\0';
                local_568[4] = '\0';
                local_568[5] = '\0';
                local_568[6] = '\0';
                local_568[7] = '\0';
                local_568[8] = -0x7a;
                local_568[9] = 'K';
                local_568[10] = '\0';
                local_568[0xb] = '\0';
                local_568[0xc] = '\0';
                local_568[0xd] = '\0';
                local_568[0xe] = '\0';
                local_568[0xf] = '\0';
                local_568[0x10] = '\0';
                local_568[0x11] = '\0';
                local_568[0x12] = '\0';
                local_568[0x13] = '\0';
                local_568[0x14] = '\0';
                local_568[0x15] = '\0';
                local_568[0x16] = '\0';
                local_568[0x17] = '\0';
                local_568[0x18] = -3;
                local_568[0x19] = 'f';
                local_568[0x1a] = '$';
                local_568[0x1b] = '\0';
                local_568[0x1c] = 0;
                local_568[0x1d] = 0;
                local_568[0x1e] = 0;
                local_568[0x1f] = 0;
                local_568[0x20] = 0x65;
                local_568[0x21] = '\0';
                local_568[0x22] = '\0';
                local_568[0x23] = 0;
                local_568[0x24] = 0;
                local_568[0x25] = 0;
                local_568[0x26] = 0;
                local_568[0x27] = 0;
                (*(code *)PTR_error_impl_00297798)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
                pNVar19 = this->m_buf;
              }
              if ((pNVar19[uVar1].m_type.type & KEYREF) != NOTYPE) {
                pcVar17 = key(this,*(size_t *)((long)&prVar14->node + lVar28));
                iVar16 = basic_substring<const_char>::compare(pcVar17,"<<",2);
                if (iVar16 == 0) {
                  uVar1 = *(ulong *)((long)&prVar14->node + lVar28);
                  if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7a;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  if ((~(int)this->m_buf[uVar1].m_type.type & 3U) != 0) {
                    builtin_strncpy(local_568,"check failed: (is_keyval(rd.node))",0x23);
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_3c0 = 0;
                    uStack_3b8 = 0x673a;
                    local_3b0 = 0;
                    pcStack_3a8 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                    ;
                    local_3a0 = 0x65;
                    auVar4 = ZEXT1224(ZEXT412(0x673a) << 0x40);
                    LVar9.name.str._0_4_ = 0x2466fd;
                    LVar9.super_LineCol.offset = auVar4._0_8_;
                    LVar9.super_LineCol.line = auVar4._8_8_;
                    LVar9.super_LineCol.col = auVar4._16_8_;
                    LVar9.name.str._4_4_ = 0;
                    LVar9.name.len = 0x65;
                    (*(this->m_callbacks).m_error)
                              (local_568,0x23,LVar9,(this->m_callbacks).m_user_data);
                  }
                  sVar20 = Tree::parent(this,*(size_t *)((long)&prVar14->node + lVar28));
                  sVar21 = prev_sibling(this,*(size_t *)((long)&prVar14->node + lVar28));
                  duplicate_children_no_rep
                            (this,this,*(size_t *)((long)&prVar14->target + lVar28),sVar20,sVar21);
                  sVar20 = *(size_t *)((long)&prVar14->node + lVar28);
                  remove_children(this,sVar20);
                  _release(this,sVar20);
                  goto LAB_0020c399;
                }
              }
            }
            uVar1 = *(ulong *)((long)&(prVar14->type).type + lVar28);
            if ((uVar1 & 0x40) == 0) {
              if (-1 < (char)uVar1) {
                builtin_strncpy(local_568,"check failed: (rd.type.is_val_ref())",0x25);
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_4b0 = 0;
                uStack_4a8 = 0x6754;
                local_4a0 = 0;
                pcStack_498 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_490 = 0x65;
                auVar4 = ZEXT1224(ZEXT412(0x6754) << 0x40);
                LVar5.name.str._0_4_ = 0x2466fd;
                LVar5.super_LineCol.offset = auVar4._0_8_;
                LVar5.super_LineCol.line = auVar4._8_8_;
                LVar5.super_LineCol.col = auVar4._16_8_;
                LVar5.name.str._4_4_ = 0;
                LVar5.name.len = 0x65;
                (*(this->m_callbacks).m_error)(local_568,0x25,LVar5,(this->m_callbacks).m_user_data)
                ;
              }
              uVar1 = *(ulong *)((long)&prVar14->target + lVar28);
              if ((uVar1 == 0xffffffffffffffff) || (uVar25 = uVar1, this->m_cap <= uVar1)) {
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_568[0] = '\0';
                local_568[1] = '\0';
                local_568[2] = '\0';
                local_568[3] = '\0';
                local_568[4] = '\0';
                local_568[5] = '\0';
                local_568[6] = '\0';
                local_568[7] = '\0';
                local_568[8] = -0x7a;
                local_568[9] = 'K';
                local_568[10] = '\0';
                local_568[0xb] = '\0';
                local_568[0xc] = '\0';
                local_568[0xd] = '\0';
                local_568[0xe] = '\0';
                local_568[0xf] = '\0';
                local_568[0x10] = '\0';
                local_568[0x11] = '\0';
                local_568[0x12] = '\0';
                local_568[0x13] = '\0';
                local_568[0x14] = '\0';
                local_568[0x15] = '\0';
                local_568[0x16] = '\0';
                local_568[0x17] = '\0';
                local_568[0x18] = -3;
                local_568[0x19] = 'f';
                local_568[0x1a] = '$';
                local_568[0x1b] = '\0';
                local_568[0x1c] = 0;
                local_568[0x1d] = 0;
                local_568[0x1e] = 0;
                local_568[0x1f] = 0;
                local_568[0x20] = 0x65;
                local_568[0x21] = '\0';
                local_568[0x22] = '\0';
                local_568[0x23] = 0;
                local_568[0x24] = 0;
                local_568[0x25] = 0;
                local_568[0x26] = 0;
                local_568[0x27] = 0;
                (*(code *)PTR_error_impl_00297798)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
                uVar25 = *(size_t *)((long)&prVar14->target + lVar28);
              }
              if ((~(int)this->m_buf[uVar1].m_type.type & 0x102U) == 0) {
                pcVar17 = key_anchor(this,uVar25);
                pcVar18 = val_ref(this,*(size_t *)((long)&prVar14->node + lVar28));
                iVar16 = basic_substring<const_char>::compare(pcVar17,pcVar18->str,pcVar18->len);
                uVar25 = *(ulong *)((long)&prVar14->target + lVar28);
                if (iVar16 == 0) {
                  if ((uVar25 == 0xffffffffffffffff) || (this->m_cap <= uVar25)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7a;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  if ((this->m_buf[uVar25].m_type.type & (STREAM|MAP)) != NOTYPE) {
                    builtin_strncpy(local_568,"check failed: !is_container(rd.target)",0x27);
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_4d8 = 0;
                    uStack_4d0 = 0x6757;
                    local_4c8 = 0;
                    pcStack_4c0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                    ;
                    local_4b8 = 0x65;
                    auVar4 = ZEXT1224(ZEXT412(0x6757) << 0x40);
                    LVar10.name.str._0_4_ = 0x2466fd;
                    LVar10.super_LineCol.offset = auVar4._0_8_;
                    LVar10.super_LineCol.line = auVar4._8_8_;
                    LVar10.super_LineCol.col = auVar4._16_8_;
                    LVar10.name.str._4_4_ = 0;
                    LVar10.name.len = 0x65;
                    (*(this->m_callbacks).m_error)
                              (local_568,0x27,LVar10,(this->m_callbacks).m_user_data);
                  }
                  uVar1 = *(ulong *)((long)&prVar14->target + lVar28);
                  if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7a;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  if ((this->m_buf[uVar1].m_type.type & VAL) == NOTYPE) {
                    builtin_strncpy(local_568 + 0x10,"s_val(rd.target)",0x11);
                    builtin_strncpy(local_568,"check failed: ha",0x10);
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_500 = 0;
                    uStack_4f8 = 0x6758;
                    local_4f0 = 0;
                    pcStack_4e8 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                    ;
                    local_4e0 = 0x65;
                    auVar4 = ZEXT1224(ZEXT412(0x6758) << 0x40);
                    LVar11.name.str._0_4_ = 0x2466fd;
                    LVar11.super_LineCol.offset = auVar4._0_8_;
                    LVar11.super_LineCol.line = auVar4._8_8_;
                    LVar11.super_LineCol.col = auVar4._16_8_;
                    LVar11.name.str._4_4_ = 0;
                    LVar11.name.len = 0x65;
                    (*(this->m_callbacks).m_error)
                              (local_568,0x21,LVar11,(this->m_callbacks).m_user_data);
                  }
                  pcVar17 = key(this,*(size_t *)((long)&prVar14->target + lVar28));
                  uVar1 = *(ulong *)((long)&prVar14->node + lVar28);
                  if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7d;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  sVar20 = pcVar17->len;
                  pcVar18 = &this->m_buf[uVar1].m_val.scalar;
                  pcVar18->str = pcVar17->str;
                  pcVar18->len = sVar20;
                  sVar20 = *(size_t *)((long)&prVar14->node + lVar28);
                  if ((sVar20 == 0xffffffffffffffff) || (this->m_cap <= sVar20)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7d;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  pNVar19 = this->m_buf;
                  NVar24 = pNVar19[sVar20].m_type.type | VAL;
                  _check_next_flags(this,sVar20,NVar24);
                  goto LAB_0020c392;
                }
              }
              duplicate_contents(this,this,uVar25,*(size_t *)((long)&prVar14->node + lVar28));
            }
            else {
              uVar1 = *(ulong *)((long)&prVar14->node + lVar28);
              if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_568[0] = '\0';
                local_568[1] = '\0';
                local_568[2] = '\0';
                local_568[3] = '\0';
                local_568[4] = '\0';
                local_568[5] = '\0';
                local_568[6] = '\0';
                local_568[7] = '\0';
                local_568[8] = -0x7a;
                local_568[9] = 'K';
                local_568[10] = '\0';
                local_568[0xb] = '\0';
                local_568[0xc] = '\0';
                local_568[0xd] = '\0';
                local_568[0xe] = '\0';
                local_568[0xf] = '\0';
                local_568[0x10] = '\0';
                local_568[0x11] = '\0';
                local_568[0x12] = '\0';
                local_568[0x13] = '\0';
                local_568[0x14] = '\0';
                local_568[0x15] = '\0';
                local_568[0x16] = '\0';
                local_568[0x17] = '\0';
                local_568[0x18] = -3;
                local_568[0x19] = 'f';
                local_568[0x1a] = '$';
                local_568[0x1b] = '\0';
                local_568[0x1c] = 0;
                local_568[0x1d] = 0;
                local_568[0x1e] = 0;
                local_568[0x1f] = 0;
                local_568[0x20] = 0x65;
                local_568[0x21] = '\0';
                local_568[0x22] = '\0';
                local_568[0x23] = 0;
                local_568[0x24] = 0;
                local_568[0x25] = 0;
                local_568[0x26] = 0;
                local_568[0x27] = 0;
                (*(code *)PTR_error_impl_00297798)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
              }
              if ((this->m_buf[uVar1].m_type.type & KEYREF) == NOTYPE) {
                builtin_strncpy(local_568,"check failed: (is_key_ref(rd.node))",0x24);
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_3e8 = 0;
                uStack_3e0 = 0x6742;
                local_3d8 = 0;
                pcStack_3d0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_3c8 = 0x65;
                auVar4 = ZEXT1224(ZEXT412(0x6742) << 0x40);
                LVar6.name.str._0_4_ = 0x2466fd;
                LVar6.super_LineCol.offset = auVar4._0_8_;
                LVar6.super_LineCol.line = auVar4._8_8_;
                LVar6.super_LineCol.col = auVar4._16_8_;
                LVar6.name.str._4_4_ = 0;
                LVar6.name.len = 0x65;
                (*(this->m_callbacks).m_error)(local_568,0x24,LVar6,(this->m_callbacks).m_user_data)
                ;
              }
              uVar1 = *(ulong *)((long)&prVar14->target + lVar28);
              if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_568[0] = '\0';
                local_568[1] = '\0';
                local_568[2] = '\0';
                local_568[3] = '\0';
                local_568[4] = '\0';
                local_568[5] = '\0';
                local_568[6] = '\0';
                local_568[7] = '\0';
                local_568[8] = -0x7a;
                local_568[9] = 'K';
                local_568[10] = '\0';
                local_568[0xb] = '\0';
                local_568[0xc] = '\0';
                local_568[0xd] = '\0';
                local_568[0xe] = '\0';
                local_568[0xf] = '\0';
                local_568[0x10] = '\0';
                local_568[0x11] = '\0';
                local_568[0x12] = '\0';
                local_568[0x13] = '\0';
                local_568[0x14] = '\0';
                local_568[0x15] = '\0';
                local_568[0x16] = '\0';
                local_568[0x17] = '\0';
                local_568[0x18] = -3;
                local_568[0x19] = 'f';
                local_568[0x1a] = '$';
                local_568[0x1b] = '\0';
                local_568[0x1c] = 0;
                local_568[0x1d] = 0;
                local_568[0x1e] = 0;
                local_568[0x1f] = 0;
                local_568[0x20] = 0x65;
                local_568[0x21] = '\0';
                local_568[0x22] = '\0';
                local_568[0x23] = 0;
                local_568[0x24] = 0;
                local_568[0x25] = 0;
                local_568[0x26] = 0;
                local_568[0x27] = 0;
                (*(code *)PTR_error_impl_00297798)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
              }
              pNVar19 = this->m_buf;
              if ((~(int)pNVar19[uVar1].m_type.type & 0x102U) != 0) {
                uVar1 = *(ulong *)((long)&prVar14->target + lVar28);
                if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                  if (((byte)s_error_flags & 1) != 0) {
                    bVar15 = is_debugger_attached();
                    if (bVar15) {
                      pcVar2 = (code *)swi(3);
                      (*pcVar2)();
                      return;
                    }
                  }
                  local_568[0] = '\0';
                  local_568[1] = '\0';
                  local_568[2] = '\0';
                  local_568[3] = '\0';
                  local_568[4] = '\0';
                  local_568[5] = '\0';
                  local_568[6] = '\0';
                  local_568[7] = '\0';
                  local_568[8] = -0x7a;
                  local_568[9] = 'K';
                  local_568[10] = '\0';
                  local_568[0xb] = '\0';
                  local_568[0xc] = '\0';
                  local_568[0xd] = '\0';
                  local_568[0xe] = '\0';
                  local_568[0xf] = '\0';
                  local_568[0x10] = '\0';
                  local_568[0x11] = '\0';
                  local_568[0x12] = '\0';
                  local_568[0x13] = '\0';
                  local_568[0x14] = '\0';
                  local_568[0x15] = '\0';
                  local_568[0x16] = '\0';
                  local_568[0x17] = '\0';
                  local_568[0x18] = -3;
                  local_568[0x19] = 'f';
                  local_568[0x1a] = '$';
                  local_568[0x1b] = '\0';
                  local_568[0x1c] = 0;
                  local_568[0x1d] = 0;
                  local_568[0x1e] = 0;
                  local_568[0x1f] = 0;
                  local_568[0x20] = 0x65;
                  local_568[0x21] = '\0';
                  local_568[0x22] = '\0';
                  local_568[0x23] = 0;
                  local_568[0x24] = 0;
                  local_568[0x25] = 0;
                  local_568[0x26] = 0;
                  local_568[0x27] = 0;
                  (*(code *)PTR_error_impl_00297798)
                            ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                             (anonymous_namespace)::s_default_callbacks);
                  pNVar19 = this->m_buf;
                }
                NVar24 = pNVar19[uVar1].m_type.type;
                if (((byte)(NVar24 >> 9) & (NVar24 & (SEQ|MAP|VAL)) != NOTYPE) == 0) {
                  pcVar26 = "check failed: (has_key_anchor(rd.target) || has_val_anchor(rd.target))"
                  ;
                  pcVar27 = local_568;
                  for (lVar23 = 8; lVar23 != 0; lVar23 = lVar23 + -1) {
                    *(undefined8 *)pcVar27 = *(undefined8 *)pcVar26;
                    pcVar26 = pcVar26 + ((ulong)bVar29 * -2 + 1) * 8;
                    pcVar27 = pcVar27 + ((ulong)bVar29 * -2 + 1) * 8;
                  }
                  uStack_524 = 0x2929;
                  uStack_528 = 0x74656772;
                  if (((byte)s_error_flags & 1) != 0) {
                    bVar15 = is_debugger_attached();
                    if (bVar15) {
                      pcVar2 = (code *)swi(3);
                      (*pcVar2)();
                      return;
                    }
                  }
                  local_410 = 0;
                  uStack_408 = 0x6743;
                  local_400 = 0;
                  pcStack_3f8 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  local_3f0 = 0x65;
                  auVar4 = ZEXT1224(ZEXT412(0x6743) << 0x40);
                  LVar7.name.str._0_4_ = 0x2466fd;
                  LVar7.super_LineCol.offset = auVar4._0_8_;
                  LVar7.super_LineCol.line = auVar4._8_8_;
                  LVar7.super_LineCol.col = auVar4._16_8_;
                  LVar7.name.str._4_4_ = 0;
                  LVar7.name.len = 0x65;
                  (*(this->m_callbacks).m_error)
                            (local_568,0x47,LVar7,(this->m_callbacks).m_user_data);
                }
              }
              uVar1 = *(ulong *)((long)&prVar14->target + lVar28);
              if ((uVar1 == 0xffffffffffffffff) || (uVar25 = uVar1, this->m_cap <= uVar1)) {
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_568[0] = '\0';
                local_568[1] = '\0';
                local_568[2] = '\0';
                local_568[3] = '\0';
                local_568[4] = '\0';
                local_568[5] = '\0';
                local_568[6] = '\0';
                local_568[7] = '\0';
                local_568[8] = -0x7a;
                local_568[9] = 'K';
                local_568[10] = '\0';
                local_568[0xb] = '\0';
                local_568[0xc] = '\0';
                local_568[0xd] = '\0';
                local_568[0xe] = '\0';
                local_568[0xf] = '\0';
                local_568[0x10] = '\0';
                local_568[0x11] = '\0';
                local_568[0x12] = '\0';
                local_568[0x13] = '\0';
                local_568[0x14] = '\0';
                local_568[0x15] = '\0';
                local_568[0x16] = '\0';
                local_568[0x17] = '\0';
                local_568[0x18] = -3;
                local_568[0x19] = 'f';
                local_568[0x1a] = '$';
                local_568[0x1b] = '\0';
                local_568[0x1c] = 0;
                local_568[0x1d] = 0;
                local_568[0x1e] = 0;
                local_568[0x1f] = 0;
                local_568[0x20] = 0x65;
                local_568[0x21] = '\0';
                local_568[0x22] = '\0';
                local_568[0x23] = 0;
                local_568[0x24] = 0;
                local_568[0x25] = 0;
                local_568[0x26] = 0;
                local_568[0x27] = 0;
                (*(code *)PTR_error_impl_00297798)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
                uVar25 = *(size_t *)((long)&prVar14->target + lVar28);
              }
              NVar24 = this->m_buf[uVar1].m_type.type;
              if ((NVar24 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar24 >> 9 & 1) != 0) {
                pcVar17 = val_anchor(this,uVar25);
                pcVar18 = key_ref(this,*(size_t *)((long)&prVar14->node + lVar28));
                iVar16 = basic_substring<const_char>::compare(pcVar17,pcVar18->str,pcVar18->len);
                uVar25 = *(ulong *)((long)&prVar14->target + lVar28);
                if (iVar16 == 0) {
                  if ((uVar25 == 0xffffffffffffffff) || (this->m_cap <= uVar25)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7a;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  if ((this->m_buf[uVar25].m_type.type & (STREAM|MAP)) != NOTYPE) {
                    builtin_strncpy(local_568,"check failed: !is_container(rd.target)",0x27);
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_438 = 0;
                    uStack_430 = 0x6746;
                    local_428 = 0;
                    pcStack_420 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                    ;
                    local_418 = 0x65;
                    auVar4 = ZEXT1224(ZEXT412(0x6746) << 0x40);
                    LVar12.name.str._0_4_ = 0x2466fd;
                    LVar12.super_LineCol.offset = auVar4._0_8_;
                    LVar12.super_LineCol.line = auVar4._8_8_;
                    LVar12.super_LineCol.col = auVar4._16_8_;
                    LVar12.name.str._4_4_ = 0;
                    LVar12.name.len = 0x65;
                    (*(this->m_callbacks).m_error)
                              (local_568,0x27,LVar12,(this->m_callbacks).m_user_data);
                  }
                  uVar1 = *(ulong *)((long)&prVar14->target + lVar28);
                  if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7a;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  if ((this->m_buf[uVar1].m_type.type & VAL) == NOTYPE) {
                    builtin_strncpy(local_568 + 0x10,"s_val(rd.target)",0x11);
                    builtin_strncpy(local_568,"check failed: ha",0x10);
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_460 = 0;
                    uStack_458 = 0x6747;
                    local_450 = 0;
                    pcStack_448 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                    ;
                    local_440 = 0x65;
                    auVar4 = ZEXT1224(ZEXT412(0x6747) << 0x40);
                    LVar13.name.str._0_4_ = 0x2466fd;
                    LVar13.super_LineCol.offset = auVar4._0_8_;
                    LVar13.super_LineCol.line = auVar4._8_8_;
                    LVar13.super_LineCol.col = auVar4._16_8_;
                    LVar13.name.str._4_4_ = 0;
                    LVar13.name.len = 0x65;
                    (*(this->m_callbacks).m_error)
                              (local_568,0x21,LVar13,(this->m_callbacks).m_user_data);
                  }
                  pcVar17 = val(this,*(size_t *)((long)&prVar14->target + lVar28));
                  uVar1 = *(ulong *)((long)&prVar14->node + lVar28);
                  if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7d;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  sVar20 = pcVar17->len;
                  pcVar18 = &this->m_buf[uVar1].m_key.scalar;
                  pcVar18->str = pcVar17->str;
                  pcVar18->len = sVar20;
                  sVar20 = *(size_t *)((long)&prVar14->node + lVar28);
                  if ((sVar20 == 0xffffffffffffffff) || (this->m_cap <= sVar20)) {
                    if (((byte)s_error_flags & 1) != 0) {
                      bVar15 = is_debugger_attached();
                      if (bVar15) {
                        pcVar2 = (code *)swi(3);
                        (*pcVar2)();
                        return;
                      }
                    }
                    local_568[0] = '\0';
                    local_568[1] = '\0';
                    local_568[2] = '\0';
                    local_568[3] = '\0';
                    local_568[4] = '\0';
                    local_568[5] = '\0';
                    local_568[6] = '\0';
                    local_568[7] = '\0';
                    local_568[8] = -0x7d;
                    local_568[9] = 'K';
                    local_568[10] = '\0';
                    local_568[0xb] = '\0';
                    local_568[0xc] = '\0';
                    local_568[0xd] = '\0';
                    local_568[0xe] = '\0';
                    local_568[0xf] = '\0';
                    local_568[0x10] = '\0';
                    local_568[0x11] = '\0';
                    local_568[0x12] = '\0';
                    local_568[0x13] = '\0';
                    local_568[0x14] = '\0';
                    local_568[0x15] = '\0';
                    local_568[0x16] = '\0';
                    local_568[0x17] = '\0';
                    local_568[0x18] = -3;
                    local_568[0x19] = 'f';
                    local_568[0x1a] = '$';
                    local_568[0x1b] = '\0';
                    local_568[0x1c] = 0;
                    local_568[0x1d] = 0;
                    local_568[0x1e] = 0;
                    local_568[0x1f] = 0;
                    local_568[0x20] = 0x65;
                    local_568[0x21] = '\0';
                    local_568[0x22] = '\0';
                    local_568[0x23] = 0;
                    local_568[0x24] = 0;
                    local_568[0x25] = 0;
                    local_568[0x26] = 0;
                    local_568[0x27] = 0;
                    (*(code *)PTR_error_impl_00297798)
                              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                               (anonymous_namespace)::s_default_callbacks);
                  }
                  pNVar19 = this->m_buf;
                  NVar24 = pNVar19[sVar20].m_type.type | KEY;
                  _check_next_flags(this,sVar20,NVar24);
                  pNVar19[sVar20].m_type.type = NVar24;
                  goto LAB_0020c399;
                }
              }
              pcVar17 = key_anchor(this,uVar25);
              pcVar18 = key_ref(this,*(size_t *)((long)&prVar14->node + lVar28));
              iVar16 = basic_substring<const_char>::compare(pcVar17,pcVar18->str,pcVar18->len);
              if (iVar16 != 0) {
                builtin_strncpy(local_568,"check failed: key_anchor(rd.target) == key_ref(rd.node)",
                                0x38);
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_488 = 0;
                uStack_480 = 0x674d;
                local_478 = 0;
                pcStack_470 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_468 = 0x65;
                auVar4 = ZEXT1224(ZEXT412(0x674d) << 0x40);
                LVar8.name.str._0_4_ = 0x2466fd;
                LVar8.super_LineCol.offset = auVar4._0_8_;
                LVar8.super_LineCol.line = auVar4._8_8_;
                LVar8.super_LineCol.col = auVar4._16_8_;
                LVar8.name.str._4_4_ = 0;
                LVar8.name.len = 0x65;
                (*(this->m_callbacks).m_error)(local_568,0x38,LVar8,(this->m_callbacks).m_user_data)
                ;
              }
              pcVar17 = key(this,*(size_t *)((long)&prVar14->target + lVar28));
              uVar1 = *(ulong *)((long)&prVar14->node + lVar28);
              if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_568[0] = '\0';
                local_568[1] = '\0';
                local_568[2] = '\0';
                local_568[3] = '\0';
                local_568[4] = '\0';
                local_568[5] = '\0';
                local_568[6] = '\0';
                local_568[7] = '\0';
                local_568[8] = -0x7d;
                local_568[9] = 'K';
                local_568[10] = '\0';
                local_568[0xb] = '\0';
                local_568[0xc] = '\0';
                local_568[0xd] = '\0';
                local_568[0xe] = '\0';
                local_568[0xf] = '\0';
                local_568[0x10] = '\0';
                local_568[0x11] = '\0';
                local_568[0x12] = '\0';
                local_568[0x13] = '\0';
                local_568[0x14] = '\0';
                local_568[0x15] = '\0';
                local_568[0x16] = '\0';
                local_568[0x17] = '\0';
                local_568[0x18] = -3;
                local_568[0x19] = 'f';
                local_568[0x1a] = '$';
                local_568[0x1b] = '\0';
                local_568[0x1c] = 0;
                local_568[0x1d] = 0;
                local_568[0x1e] = 0;
                local_568[0x1f] = 0;
                local_568[0x20] = 0x65;
                local_568[0x21] = '\0';
                local_568[0x22] = '\0';
                local_568[0x23] = 0;
                local_568[0x24] = 0;
                local_568[0x25] = 0;
                local_568[0x26] = 0;
                local_568[0x27] = 0;
                (*(code *)PTR_error_impl_00297798)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
              }
              sVar20 = pcVar17->len;
              pcVar18 = &this->m_buf[uVar1].m_key.scalar;
              pcVar18->str = pcVar17->str;
              pcVar18->len = sVar20;
              sVar20 = *(size_t *)((long)&prVar14->node + lVar28);
              if ((sVar20 == 0xffffffffffffffff) || (this->m_cap <= sVar20)) {
                if (((byte)s_error_flags & 1) != 0) {
                  bVar15 = is_debugger_attached();
                  if (bVar15) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                local_568[0] = '\0';
                local_568[1] = '\0';
                local_568[2] = '\0';
                local_568[3] = '\0';
                local_568[4] = '\0';
                local_568[5] = '\0';
                local_568[6] = '\0';
                local_568[7] = '\0';
                local_568[8] = -0x7d;
                local_568[9] = 'K';
                local_568[10] = '\0';
                local_568[0xb] = '\0';
                local_568[0xc] = '\0';
                local_568[0xd] = '\0';
                local_568[0xe] = '\0';
                local_568[0xf] = '\0';
                local_568[0x10] = '\0';
                local_568[0x11] = '\0';
                local_568[0x12] = '\0';
                local_568[0x13] = '\0';
                local_568[0x14] = '\0';
                local_568[0x15] = '\0';
                local_568[0x16] = '\0';
                local_568[0x17] = '\0';
                local_568[0x18] = -3;
                local_568[0x19] = 'f';
                local_568[0x1a] = '$';
                local_568[0x1b] = '\0';
                local_568[0x1c] = 0;
                local_568[0x1d] = 0;
                local_568[0x1e] = 0;
                local_568[0x1f] = 0;
                local_568[0x20] = 0x65;
                local_568[0x21] = '\0';
                local_568[0x22] = '\0';
                local_568[0x23] = 0;
                local_568[0x24] = 0;
                local_568[0x25] = 0;
                local_568[0x26] = 0;
                local_568[0x27] = 0;
                (*(code *)PTR_error_impl_00297798)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
              }
              pNVar19 = this->m_buf;
              NVar24 = pNVar19[sVar20].m_type.type | VAL;
              _check_next_flags(this,sVar20,NVar24);
LAB_0020c392:
              pNVar19[sVar20].m_type.type = NVar24;
            }
          }
          else {
            if (this->m_cap <= uVar1) {
              if (((byte)s_error_flags & 1) != 0) {
                bVar15 = is_debugger_attached();
                if (bVar15) {
                  pcVar2 = (code *)swi(3);
                  (*pcVar2)();
                  return;
                }
              }
              local_568[0] = '\0';
              local_568[1] = '\0';
              local_568[2] = '\0';
              local_568[3] = '\0';
              local_568[4] = '\0';
              local_568[5] = '\0';
              local_568[6] = '\0';
              local_568[7] = '\0';
              local_568[8] = -0x7a;
              local_568[9] = 'K';
              local_568[10] = '\0';
              local_568[0xb] = '\0';
              local_568[0xc] = '\0';
              local_568[0xd] = '\0';
              local_568[0xe] = '\0';
              local_568[0xf] = '\0';
              local_568[0x10] = '\0';
              local_568[0x11] = '\0';
              local_568[0x12] = '\0';
              local_568[0x13] = '\0';
              local_568[0x14] = '\0';
              local_568[0x15] = '\0';
              local_568[0x16] = '\0';
              local_568[0x17] = '\0';
              local_568[0x18] = -3;
              local_568[0x19] = 'f';
              local_568[0x1a] = '$';
              local_568[0x1b] = '\0';
              local_568[0x1c] = 0;
              local_568[0x1d] = 0;
              local_568[0x1e] = 0;
              local_568[0x1f] = 0;
              local_568[0x20] = 0x65;
              local_568[0x21] = '\0';
              local_568[0x22] = '\0';
              local_568[0x23] = 0;
              local_568[0x24] = 0;
              local_568[0x25] = 0;
              local_568[0x26] = 0;
              local_568[0x27] = 0;
              (*(code *)PTR_error_impl_00297798)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
            }
            if ((this->m_buf[uVar1].m_type.type & SEQ) == NOTYPE) {
              builtin_strncpy(local_568,"check failed: (is_seq(rd.parent_ref))",0x26);
              if (((byte)s_error_flags & 1) != 0) {
                bVar15 = is_debugger_attached();
                if (bVar15) {
                  pcVar2 = (code *)swi(3);
                  (*pcVar2)();
                  return;
                }
              }
              local_398 = 0;
              uStack_390 = 0x6727;
              local_388 = 0;
              pcStack_380 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_378 = 0x65;
              auVar4 = ZEXT1224(ZEXT412(0x6727) << 0x40);
              LVar3.name.str._0_4_ = 0x2466fd;
              LVar3.super_LineCol.offset = auVar4._0_8_;
              LVar3.super_LineCol.line = auVar4._8_8_;
              LVar3.super_LineCol.col = auVar4._16_8_;
              LVar3.name.str._4_4_ = 0;
              LVar3.name.len = 0x65;
              (*(this->m_callbacks).m_error)(local_568,0x26,LVar3,(this->m_callbacks).m_user_data);
            }
            parent = Tree::parent(this,*(size_t *)((long)&prVar14->parent_ref + lVar28));
            sVar20 = *(size_t *)((long)&prVar14->parent_ref + lVar28);
            sVar21 = local_510;
            if (local_518 != sVar20) {
              sVar21 = sVar20;
            }
            local_510 = duplicate_children_no_rep
                                  (this,this,*(size_t *)((long)&prVar14->target + lVar28),parent,
                                   sVar21);
            sVar21 = *(size_t *)((long)&prVar14->node + lVar28);
            remove_children(this,sVar21);
            _release(this,sVar21);
            local_518 = sVar20;
          }
        }
LAB_0020c399:
        lVar28 = lVar28 + 0x30;
      } while (local_508 != lVar28);
      if (local_370.refs.m_size != 0) {
        lVar28 = 0;
        do {
          rem_anchor_ref(this,*(size_t *)((long)&(local_370.refs.m_stack)->node + lVar28));
          sVar20 = *(size_t *)((long)&(local_370.refs.m_stack)->parent_ref + lVar28);
          if (sVar20 != 0xffffffffffffffff) {
            NVar22 = type(this,sVar20);
            if (NVar22.type != NOTYPE) {
              sVar20 = *(size_t *)((long)&(local_370.refs.m_stack)->parent_ref + lVar28);
              remove_children(this,sVar20);
              _release(this,sVar20);
            }
          }
          lVar28 = lVar28 + 0x30;
        } while (local_370.refs.m_size * 0x30 != lVar28);
      }
    }
    detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::_free(&local_370.refs);
  }
  return;
}

Assistant:

void Tree::resolve()
{
    if(m_size == 0)
        return;

    detail::ReferenceResolver rr(this);

    // insert the resolved references
    size_t prev_parent_ref = NONE;
    size_t prev_parent_ref_after = NONE;
    for(auto const& C4_RESTRICT rd : rr.refs)
    {
        if( ! rd.type.is_ref())
            continue;
        if(rd.parent_ref != NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, is_seq(rd.parent_ref));
            size_t after, p = parent(rd.parent_ref);
            if(prev_parent_ref != rd.parent_ref)
            {
                after = rd.parent_ref;//prev_sibling(rd.parent_ref_sibling);
                prev_parent_ref_after = after;
            }
            else
            {
                after = prev_parent_ref_after;
            }
            prev_parent_ref = rd.parent_ref;
            prev_parent_ref_after = duplicate_children_no_rep(rd.target, p, after);
            remove(rd.node);
        }
        else
        {
            if(has_key(rd.node) && is_key_ref(rd.node) && key(rd.node) == "<<")
            {
                _RYML_CB_ASSERT(m_callbacks, is_keyval(rd.node));
                size_t p = parent(rd.node);
                size_t after = prev_sibling(rd.node);
                duplicate_children_no_rep(rd.target, p, after);
                remove(rd.node);
            }
            else if(rd.type.is_key_ref())
            {
                _RYML_CB_ASSERT(m_callbacks, is_key_ref(rd.node));
                _RYML_CB_ASSERT(m_callbacks, has_key_anchor(rd.target) || has_val_anchor(rd.target));
                if(has_val_anchor(rd.target) && val_anchor(rd.target) == key_ref(rd.node))
                {
                    _RYML_CB_CHECK(m_callbacks, !is_container(rd.target));
                    _RYML_CB_CHECK(m_callbacks, has_val(rd.target));
                    _p(rd.node)->m_key.scalar = val(rd.target);
                    _add_flags(rd.node, KEY);
                }
                else
                {
                    _RYML_CB_CHECK(m_callbacks, key_anchor(rd.target) == key_ref(rd.node));
                    _p(rd.node)->m_key.scalar = key(rd.target);
                    _add_flags(rd.node, VAL);
                }
            }
            else
            {
                _RYML_CB_ASSERT(m_callbacks, rd.type.is_val_ref());
                if(has_key_anchor(rd.target) && key_anchor(rd.target) == val_ref(rd.node))
                {
                    _RYML_CB_CHECK(m_callbacks, !is_container(rd.target));
                    _RYML_CB_CHECK(m_callbacks, has_val(rd.target));
                    _p(rd.node)->m_val.scalar = key(rd.target);
                    _add_flags(rd.node, VAL);
                }
                else
                {
                    duplicate_contents(rd.target, rd.node);
                }
            }
        }
    }

    // clear anchors and refs
    for(auto const& C4_RESTRICT ar : rr.refs)
    {
        rem_anchor_ref(ar.node);
        if(ar.parent_ref != NONE)
            if(type(ar.parent_ref) != NOTYPE)
                remove(ar.parent_ref);
    }

}